

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
StringInstance::op_eraseFromIndex
          (StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  undefined8 *puVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  int from_index;
  allocator local_81 [9];
  string *in_stack_ffffffffffffff88;
  IntegerInstance *in_stack_ffffffffffffff90;
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar3 != 1) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDX,0);
  IntegerInstance::IntegerInstance(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  iVar1 = IntegerInstance::value((IntegerInstance *)(local_81 + 1));
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1bd9f9);
  if (-1 < iVar1) {
    iVar2 = std::__cxx11::string::size();
    if (iVar1 <= iVar2) {
      std::__cxx11::string::erase(in_RSI + 0x58,(long)iVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,"null",local_81);
      std::allocator<char>::~allocator((allocator<char> *)local_81);
      return in_RDI;
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_eraseFromIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int from_index = IntegerInstance(arguments[0]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    _value.erase(from_index);
    return "null";
}